

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int help(int argc,char **argv)

{
  iterator iVar1;
  allocator<char> local_51;
  key_type local_50;
  
  if (argc == 0) {
    help();
  }
  else {
    for (; *argv != (char *)0x0; argv = argv + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*argv,&local_51);
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
              ::find(&commandUsage_abi_cxx11_._M_t,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar1._M_node ==
          &commandUsage_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        fprintf(_stderr,"imgtool help: command \"%s\" not known.\n",*argv);
        help();
        return 1;
      }
      fprintf(_stderr,"usage: imgtool %s\n\n",*(undefined8 *)(iVar1._M_node + 2));
      fprintf(_stderr,"options:%s\n",*(undefined8 *)(iVar1._M_node + 3));
    }
  }
  return 0;
}

Assistant:

int help(int argc, char **argv) {
    if (argc == 0) {
        help();
        return 0;
    }
    while (*argv != nullptr) {
        auto iter = commandUsage.find(*argv);
        if (iter == commandUsage.end()) {
            fprintf(stderr, "imgtool help: command \"%s\" not known.\n", *argv);
            help();
            return 1;
        } else {
            fprintf(stderr, "usage: imgtool %s\n\n", iter->second.usage.c_str());
            fprintf(stderr, "options:%s\n", iter->second.options.c_str());
        }
        ++argv;
    }
    return 0;
}